

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void custom_compare_variable_test(void)

{
  undefined8 uVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  char *__format;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *in_R8;
  long lVar7;
  code *pcVar8;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db2;
  uint64_t user_param;
  void *params [1];
  fdb_custom_cmp_variable functions [1];
  char *kvs_names [1];
  timeval __test_begin;
  char keybuf [256];
  char prev_key [256];
  fdb_config fconfig;
  char bodybuf [256];
  undefined1 local_23e8 [24];
  fdb_file_handle *local_23d0;
  fdb_kvs_handle *local_23c8;
  fdb_file_handle *local_23c0;
  code *local_23b8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_23b0;
  fdb_file_handle *local_23a8;
  filemgr *local_23a0;
  fdb_custom_cmp_variable local_2398;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_2390;
  timeval local_2388;
  char local_2378 [8];
  char acStack_2370 [7];
  undefined1 local_2369;
  char local_2278 [264];
  fdb_config local_2170;
  char local_2078 [256];
  fdb_doc *local_1f78 [1001];
  
  gettimeofday(&local_2388,(__timezone_ptr_t)0x0);
  memleak_start();
  local_23e8._0_8_ = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_2170.seqtree_opt = '\x01';
  local_2170.buffercache_size = 0;
  local_2170.wal_threshold = 0x400;
  local_2170.flags = 1;
  local_2170.compaction_threshold = '\0';
  local_2170.multi_kv_instances = true;
  paStack_23b0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&local_23a8;
  local_23a8 = (fdb_file_handle *)0x1234;
  local_23b8 = _cmp_variable;
  fdb_open(&local_23d0,"./dummy1",&local_2170);
  fdb_kvs_open_default
            (local_23d0,(fdb_kvs_handle **)(local_23e8 + 0x10),(fdb_kvs_config *)&local_23c0);
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_23e8._16_8_,logCallbackFunc,
                     "custom_compare_variable_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    uVar6 = 0;
    do {
      lVar7 = 0;
      do {
        iVar3 = rand();
        local_2378[lVar7] = (char)iVar3 + (char)(iVar3 / 0x19) * -0x19 + 'a';
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
      sprintf(local_2378 + 2,"%06d",uVar6 & 0xffffffff);
      lVar7 = 8;
      do {
        iVar3 = rand();
        local_2378[lVar7] = (char)iVar3 + (char)(iVar3 / 0x19) * -0x19 + 'a';
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xf);
      local_2369 = 0;
      sprintf(local_2078,"value: %d",uVar6 & 0xffffffff);
      sVar5 = strlen(local_2078);
      fdb_doc_create((fdb_doc **)((long)local_1f78 + uVar6 * 8),local_2378,0x10,(void *)0x0,0,
                     local_2078,sVar5 + 1);
      fdb_set((fdb_kvs_handle *)local_23e8._16_8_,*(fdb_doc **)((long)local_1f78 + uVar6 * 8));
      uVar6 = uVar6 + 1;
    } while (uVar6 != 1000);
    lVar7 = 0;
    do {
      in_R8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      fdb_doc_create((fdb_doc **)local_23e8,(void *)(*(size_t **)((long)local_1f78 + lVar7))[4],
                     **(size_t **)((long)local_1f78 + lVar7),(void *)0x0,0,(void *)0x0,0);
      fVar2 = fdb_get((fdb_kvs_handle *)local_23e8._16_8_,(fdb_doc *)local_23e8._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_001156a6:
        custom_compare_variable_test();
        goto LAB_001156ab;
      }
      if (*(size_t *)(local_23e8._0_8_ + 0x10) !=
          *(size_t *)(*(code **)((long)local_1f78 + lVar7) + 0x10)) {
        custom_compare_variable_test();
      }
      uVar1 = local_23e8._0_8_;
      iVar3 = bcmp(*(fdb_doc **)(local_23e8._0_8_ + 0x40),
                   *(void **)(*(size_t *)((long)local_1f78 + lVar7) + 0x40),
                   *(size_t *)(local_23e8._0_8_ + 0x10));
      if (iVar3 != 0) {
        custom_compare_variable_test();
        goto LAB_001156a6;
      }
      fdb_doc_free((fdb_doc *)uVar1);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 8000);
    in_R8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
    fdb_iterator_init((fdb_kvs_handle *)local_23e8._16_8_,(fdb_iterator **)(local_23e8 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    sprintf(local_2278,"%016d",0);
    pcVar8 = (code *)0x10;
    iVar3 = 1000;
    do {
      fVar2 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001156ab;
      in_R8 = paStack_23b0;
      iVar4 = _cmp_variable(local_2278,(size_t)pcVar8,*(void **)(local_23e8._0_8_ + 0x20),
                            (size_t)*(size_t *)local_23e8._0_8_,paStack_23b0);
      if (0 < iVar4) {
        custom_compare_variable_test();
      }
      uVar1 = local_23e8._0_8_;
      pcVar8 = (code *)*(size_t *)local_23e8._0_8_;
      memcpy(local_2278,*(fdb_doc **)(local_23e8._0_8_ + 0x20),(size_t)pcVar8);
      fdb_doc_free((fdb_doc *)uVar1);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_next((fdb_iterator *)local_23e8._8_8_);
      iVar3 = iVar3 + -1;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (iVar3 != 0) goto LAB_001156ee;
    fdb_iterator_close((fdb_iterator *)local_23e8._8_8_);
    fdb_commit(local_23d0,'\x01');
    in_R8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
    fdb_iterator_init((fdb_kvs_handle *)local_23e8._16_8_,(fdb_iterator **)(local_23e8 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    sprintf(local_2278,"%016d",0);
    pcVar8 = (code *)0x10;
    iVar3 = 1000;
    do {
      fVar2 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001156b0;
      in_R8 = paStack_23b0;
      iVar4 = _cmp_variable(local_2278,(size_t)pcVar8,*(void **)(local_23e8._0_8_ + 0x20),
                            (size_t)*(size_t *)local_23e8._0_8_,paStack_23b0);
      if (0 < iVar4) {
        custom_compare_variable_test();
      }
      uVar1 = local_23e8._0_8_;
      pcVar8 = (code *)*(size_t *)local_23e8._0_8_;
      memcpy(local_2278,*(fdb_doc **)(local_23e8._0_8_ + 0x20),(size_t)pcVar8);
      fdb_doc_free((fdb_doc *)uVar1);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_next((fdb_iterator *)local_23e8._8_8_);
      iVar3 = iVar3 + -1;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (iVar3 != 0) goto LAB_001156f3;
    fdb_iterator_close((fdb_iterator *)local_23e8._8_8_);
    fdb_compact(local_23d0,"./dummy2");
    in_R8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
    fdb_iterator_init((fdb_kvs_handle *)local_23e8._16_8_,(fdb_iterator **)(local_23e8 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    sprintf(local_2278,"%016d",0);
    pcVar8 = (code *)0x10;
    iVar3 = 1000;
    do {
      fVar2 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001156b5;
      in_R8 = paStack_23b0;
      iVar4 = _cmp_variable(local_2278,(size_t)pcVar8,*(void **)(local_23e8._0_8_ + 0x20),
                            (size_t)*(size_t *)local_23e8._0_8_,paStack_23b0);
      if (0 < iVar4) {
        custom_compare_variable_test();
      }
      uVar1 = local_23e8._0_8_;
      pcVar8 = (code *)*(size_t *)local_23e8._0_8_;
      memcpy(local_2278,*(fdb_doc **)(local_23e8._0_8_ + 0x20),(size_t)pcVar8);
      fdb_doc_free((fdb_doc *)uVar1);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_next((fdb_iterator *)local_23e8._8_8_);
      iVar3 = iVar3 + -1;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (iVar3 != 0) goto LAB_001156f8;
    fdb_iterator_close((fdb_iterator *)local_23e8._8_8_);
    iVar3 = 0;
    in_R8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
    fdb_iterator_sequence_init
              ((fdb_kvs_handle *)local_23e8._16_8_,(fdb_iterator **)(local_23e8 + 8),0,0,0);
    do {
      fVar2 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001156ba;
      fdb_doc_free((fdb_doc *)local_23e8._0_8_);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_next((fdb_iterator *)local_23e8._8_8_);
      iVar3 = iVar3 + -1;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (iVar3 != -1000) goto LAB_001156fd;
    fVar2 = fdb_iterator_prev((fdb_iterator *)local_23e8._8_8_);
    if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
LAB_001156e4:
      custom_compare_variable_test();
      goto LAB_001156e9;
    }
    iVar3 = -1000;
    do {
      fVar2 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001156bf;
      fdb_doc_free((fdb_doc *)local_23e8._0_8_);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_prev((fdb_iterator *)local_23e8._8_8_);
      iVar3 = iVar3 + 1;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (iVar3 != 0) goto LAB_001156e4;
    fdb_iterator_close((fdb_iterator *)local_23e8._8_8_);
    local_23b8 = (code *)0x0;
    paStack_23b0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
    fdb_kvs_open_default(local_23d0,&local_23c8,(fdb_kvs_config *)&local_23c0);
    lVar7 = 0;
    do {
      in_R8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      fdb_doc_create((fdb_doc **)local_23e8,(void *)(*(size_t **)((long)local_1f78 + lVar7))[4],
                     **(size_t **)((long)local_1f78 + lVar7),(void *)0x0,0,(void *)0x0,0);
      fVar2 = fdb_get(local_23c8,(fdb_doc *)local_23e8._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001156cf;
      if (*(size_t *)(local_23e8._0_8_ + 0x10) !=
          *(size_t *)(*(code **)((long)local_1f78 + lVar7) + 0x10)) {
        custom_compare_variable_test();
      }
      uVar1 = local_23e8._0_8_;
      iVar3 = bcmp(*(fdb_doc **)(local_23e8._0_8_ + 0x40),
                   *(void **)(*(size_t *)((long)local_1f78 + lVar7) + 0x40),
                   *(size_t *)(local_23e8._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_001156c4;
      fdb_doc_free((fdb_doc *)uVar1);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 8000);
    fdb_kvs_close((fdb_kvs_handle *)local_23e8._16_8_);
    fdb_kvs_close(local_23c8);
    fdb_close(local_23d0);
    in_R8 = &local_2390;
    local_2390.seqtree = (btree *)0x0;
    local_2398 = _cmp_variable;
    local_23a0 = (filemgr *)&local_23a8;
    fVar2 = fdb_open_custom_cmp(&local_23d0,"./dummy2",&local_2170,1,(char **)&in_R8->seqtree,
                                &local_2398,&local_23a0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_kvs_open_default
                        (local_23d0,(fdb_kvs_handle **)(local_23e8 + 0x10),
                         (fdb_kvs_config *)&local_23c0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115707;
      lVar7 = 0;
      while( true ) {
        in_R8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
        fdb_doc_create((fdb_doc **)local_23e8,(void *)(*(size_t **)((long)local_1f78 + lVar7))[4],
                       **(size_t **)((long)local_1f78 + lVar7),(void *)0x0,0,(void *)0x0,0);
        fVar2 = fdb_get((fdb_kvs_handle *)local_23e8._16_8_,(fdb_doc *)local_23e8._0_8_);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        if (*(size_t *)(local_23e8._0_8_ + 0x10) !=
            *(size_t *)(*(code **)((long)local_1f78 + lVar7) + 0x10)) {
          custom_compare_variable_test();
        }
        uVar1 = local_23e8._0_8_;
        iVar3 = bcmp(*(fdb_doc **)(local_23e8._0_8_ + 0x40),
                     *(void **)(*(size_t *)((long)local_1f78 + lVar7) + 0x40),
                     *(size_t *)(local_23e8._0_8_ + 0x10));
        if (iVar3 != 0) goto LAB_001156d4;
        fdb_doc_free((fdb_doc *)uVar1);
        local_23e8._0_8_ = (fdb_doc *)0x0;
        lVar7 = lVar7 + 8;
        if (lVar7 == 8000) {
          fdb_kvs_close((fdb_kvs_handle *)local_23e8._16_8_);
          fdb_close(local_23d0);
          lVar7 = 0;
          do {
            fdb_doc_free(*(fdb_doc **)((long)local_1f78 + lVar7 * 8));
            lVar7 = lVar7 + 1;
          } while (lVar7 != 1000);
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (custom_compare_variable_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"custom compare function for variable length key test");
          return;
        }
      }
      goto LAB_001156df;
    }
  }
  else {
LAB_001156e9:
    custom_compare_variable_test();
LAB_001156ee:
    custom_compare_variable_test();
LAB_001156f3:
    custom_compare_variable_test();
LAB_001156f8:
    custom_compare_variable_test();
LAB_001156fd:
    custom_compare_variable_test();
  }
  custom_compare_variable_test();
LAB_00115707:
  custom_compare_variable_test();
  if (in_R8 != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
    return;
  }
  __assert_fail("user_param",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x9c2,"int _cmp_variable(void *, size_t, void *, size_t, void *)");
LAB_001156ab:
  custom_compare_variable_test();
LAB_001156b0:
  custom_compare_variable_test();
LAB_001156b5:
  custom_compare_variable_test();
LAB_001156ba:
  custom_compare_variable_test();
LAB_001156bf:
  custom_compare_variable_test();
LAB_001156c4:
  custom_compare_variable_test();
LAB_001156cf:
  custom_compare_variable_test();
LAB_001156d4:
  custom_compare_variable_test();
LAB_001156df:
  custom_compare_variable_test();
  goto LAB_001156e4;
}

Assistant:

void custom_compare_variable_test()
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 1000;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    size_t keylen = 16;
    size_t prev_keylen;
    char keybuf[256], bodybuf[256];
    char prev_key[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.seqtree_opt = FDB_SEQTREE_USE;
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    uint64_t user_param = 0x1234;
    kvs_config.custom_cmp = _cmp_variable;
    kvs_config.custom_cmp_param = (void*)&user_param;

    // open db with custom compare function for variable length key type
    //fdb_open_cmp_variable(&dbfile, "./dummy1", &fconfig);
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "custom_compare_variable_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        for (j=0;j<2;++j){
            keybuf[j] = 'a' + rand()%('z'-'a');
        }
        sprintf(keybuf+2, "%06d", i);
        for (j=8;(size_t)j<keylen-1;++j){
            keybuf[j] = 'a' + rand()%('z'-'a');
        }
        keybuf[keylen-1] = 0;
        sprintf(bodybuf, "value: %d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, keylen, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // range scan (before flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // range scan (after flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // range scan (after compaction)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    // range scan by sequence
    fdb_iterator_sequence_init(db, &iterator, 0, 0, 0x0);
    count = 0;
    do { // forward
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);

    // Reverse direction
    for (; fdb_iterator_prev(iterator) != FDB_RESULT_ITERATOR_FAIL; --count) {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    };
    TEST_CHK(count == 0);
    fdb_iterator_close(iterator);

    // open another handle
    kvs_config.custom_cmp = NULL;
    kvs_config.custom_cmp_param = NULL;
    fdb_kvs_open_default(dbfile, &db2, &kvs_config);

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_kvs_close(db2);
    fdb_close(dbfile);

    // re-open check
    //status = fdb_open(&dbfile, "./dummy2", &fconfig);
    char* kvs_names[1] = {NULL};
    fdb_custom_cmp_variable functions[1] = {_cmp_variable};
    void* params[1] = {(void*)&user_param};
    status = fdb_open_custom_cmp(&dbfile, "./dummy2", &fconfig,
                                 1, kvs_names, functions, params);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("custom compare function for variable length key test");
}